

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O3

void ApprovalTests::FileApprover::reportAfterTryingFrontLoadedReporter
               (string *receivedPath,string *approvedPath,Reporter *r)

{
  pointer pcVar1;
  char cVar2;
  shared_ptr<ApprovalTests::Reporter> tryFirst;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  long *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  FrontLoadedReporterFactory::getFrontLoadedReporter();
  local_c0[0] = local_b0;
  pcVar1 = (receivedPath->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar1,pcVar1 + receivedPath->_M_string_length);
  pcVar1 = (approvedPath->_M_dataplus)._M_p;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + approvedPath->_M_string_length);
  cVar2 = (**(code **)(*local_a0 + 0x10))(local_a0,local_c0,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if (cVar2 == '\0') {
    pcVar1 = (receivedPath->_M_dataplus)._M_p;
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + receivedPath->_M_string_length);
    pcVar1 = (approvedPath->_M_dataplus)._M_p;
    local_90[0] = local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + approvedPath->_M_string_length);
    (*r->_vptr_Reporter[2])(r,local_70,local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

void
    FileApprover::reportAfterTryingFrontLoadedReporter(const std::string& receivedPath,
                                                       const std::string& approvedPath,
                                                       const Reporter& r)
    {
        auto tryFirst = FrontLoadedReporterFactory::getFrontLoadedReporter();
        if (!tryFirst->report(receivedPath, approvedPath))
        {
            r.report(receivedPath, approvedPath);
        }
    }